

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_NodeInvUpdateObjFanoutPolarity(Abc_Obj_t *pObj,Abc_Obj_t *pFanout)

{
  int iVar1;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_SclObjIsBufInv(pFanout);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeFindFanin(pFanout,pObj);
    Abc_ObjFaninFlipPhase(pFanout,iVar1);
  }
  else {
    Abc_NodeInvUpdateFanPolarity(pFanout);
  }
  return;
}

Assistant:

void Abc_NodeInvUpdateObjFanoutPolarity( Abc_Obj_t * pObj, Abc_Obj_t * pFanout )
{
    if ( Abc_SclObjIsBufInv(pFanout) )
        Abc_NodeInvUpdateFanPolarity( pFanout );
    else
        Abc_ObjFaninFlipPhase( pFanout, Abc_NodeFindFanin(pFanout, pObj) );
}